

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeSorterWrite(sqlite3 *db,VdbeCursor *pCsr,Mem *pVal)

{
  VdbeSorter *pVVar1;
  uint uVar2;
  int iVar3;
  SorterRecord *pSVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  pVVar1 = pCsr->pSorter;
  iVar3 = pVal->n;
  uVar6 = (ulong)iVar3;
  uVar5 = 0;
  do {
    uVar2 = uVar5 + 1;
    if (uVar6 < 0x80) break;
    uVar6 = uVar6 >> 7;
    bVar7 = uVar5 < 8;
    uVar5 = uVar2;
  } while (bVar7);
  pVVar1->nInMemory = pVVar1->nInMemory + iVar3 + uVar2;
  pSVar4 = (SorterRecord *)sqlite3DbMallocRaw(db,iVar3 + 0x18);
  if (pSVar4 == (SorterRecord *)0x0) {
    iVar3 = 7;
  }
  else {
    pSVar4->pVal = pSVar4 + 1;
    memcpy(pSVar4 + 1,pVal->z,(long)pVal->n);
    pSVar4->nVal = pVal->n;
    pSVar4->pNext = pVVar1->pRecord;
    pVVar1->pRecord = pSVar4;
    iVar3 = 0;
    if ((0 < pVVar1->mxPmaSize) &&
       ((pVVar1->mxPmaSize < pVVar1->nInMemory ||
        ((iVar3 = 0, pVVar1->mnPmaSize < pVVar1->nInMemory && (mem0.nearlyFull != 0)))))) {
      iVar3 = vdbeSorterListToPMA(db,pCsr);
      pVVar1->nInMemory = 0;
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterWrite(
  sqlite3 *db,                    /* Database handle */
  const VdbeCursor *pCsr,               /* Sorter cursor */
  Mem *pVal                       /* Memory cell containing record */
){
  VdbeSorter *pSorter = pCsr->pSorter;
  int rc = SQLITE_OK;             /* Return Code */
  SorterRecord *pNew;             /* New list element */

  assert( pSorter );
  pSorter->nInMemory += sqlite3VarintLen(pVal->n) + pVal->n;

  pNew = (SorterRecord *)sqlite3DbMallocRaw(db, pVal->n + sizeof(SorterRecord));
  if( pNew==0 ){
    rc = SQLITE_NOMEM;
  }else{
    pNew->pVal = (void *)&pNew[1];
    memcpy(pNew->pVal, pVal->z, pVal->n);
    pNew->nVal = pVal->n;
    pNew->pNext = pSorter->pRecord;
    pSorter->pRecord = pNew;
  }

  /* See if the contents of the sorter should now be written out. They
  ** are written out when either of the following are true:
  **
  **   * The total memory allocated for the in-memory list is greater 
  **     than (page-size * cache-size), or
  **
  **   * The total memory allocated for the in-memory list is greater 
  **     than (page-size * 10) and sqlite3HeapNearlyFull() returns true.
  */
  if( rc==SQLITE_OK && pSorter->mxPmaSize>0 && (
        (pSorter->nInMemory>pSorter->mxPmaSize)
     || (pSorter->nInMemory>pSorter->mnPmaSize && sqlite3HeapNearlyFull())
  )){
#ifdef SQLITE_DEBUG
    i64 nExpect = pSorter->iWriteOff
                + sqlite3VarintLen(pSorter->nInMemory)
                + pSorter->nInMemory;
#endif
    rc = vdbeSorterListToPMA(db, pCsr);
    pSorter->nInMemory = 0;
    assert( rc!=SQLITE_OK || (nExpect==pSorter->iWriteOff) );
  }

  return rc;
}